

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O1

Status __thiscall spvtools::opt::CopyPropagateArrays::Process(CopyPropagateArrays *this)

{
  Module *pMVar1;
  pointer puVar2;
  __uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
  _Var3;
  long *plVar4;
  bool bVar5;
  uint32_t uVar6;
  StorageClass SVar7;
  Status SVar8;
  Instruction *in_RAX;
  _Elt_pointer ppIVar9;
  Instruction *insertion_point;
  pointer *__ptr;
  Instruction *pIVar10;
  pointer puVar11;
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  source_object;
  Instruction *local_38;
  
  pMVar1 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  puVar11 = *(pointer *)
             &(pMVar1->functions_).
              super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
              ._M_impl;
  puVar2 = *(pointer *)
            ((long)&(pMVar1->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
            + 8);
  local_38 = in_RAX;
  if (puVar11 != puVar2) {
    do {
      _Var3.
      super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>.
      _M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
      .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl =
           (puVar11->_M_t).
           super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
      ;
      plVar4 = *(long **)((long)_Var3.
                                super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                                .super__Head_base<0UL,_spvtools::opt::Function_*,_false>.
                                _M_head_impl + 0x98);
      if (plVar4 != *(long **)((long)_Var3.
                                     super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                                     .super__Head_base<0UL,_spvtools::opt::Function_*,_false>.
                                     _M_head_impl + 0xa0)) {
        for (pIVar10 = *(Instruction **)(*plVar4 + 0x20); pIVar10->opcode_ == OpVariable;
            pIVar10 = (Instruction *)
                      (((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                         *)&(pIVar10->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                            next_node_)->
                      super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                      )._M_impl.super__Vector_impl_data._M_start) {
          local_38 = pIVar10;
          std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          emplace_back<spvtools::opt::Instruction*>
                    ((deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                      *)&this->worklist_,&stack0xffffffffffffffc8);
        }
      }
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar2);
  }
  ppIVar9 = (this->worklist_).c.
            super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->worklist_).c.
      super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur == ppIVar9) {
    SVar8 = SuccessWithoutChange;
  }
  else {
    SVar8 = Failure;
    do {
      pIVar10 = *ppIVar9;
      std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      pop_front(&(this->worklist_).c);
      insertion_point = FindStoreInstruction(this,pIVar10);
      if (insertion_point != (Instruction *)0x0) {
        FindSourceObjectIfPossible
                  ((CopyPropagateArrays *)&stack0xffffffffffffffc8,(Instruction *)this,pIVar10);
        if (local_38 != (Instruction *)0x0) {
          uVar6 = 0;
          if (pIVar10->has_type_id_ == true) {
            uVar6 = Instruction::GetSingleWordOperand(pIVar10,0);
          }
          bVar5 = IsPointerToArrayType(this,uVar6);
          if (!bVar5) {
            SVar7 = MemoryObject::GetStorageClass((MemoryObject *)local_38);
            if (SVar7 != Input) goto LAB_005512c6;
          }
          uVar6 = MemoryObject::GetPointerTypeId((MemoryObject *)local_38,this);
          bVar5 = CanUpdateUses(this,pIVar10,uVar6);
          if (bVar5) {
            PropagateObject(this,pIVar10,(MemoryObject *)local_38,insertion_point);
            SVar8 = 1;
          }
        }
LAB_005512c6:
        if (local_38 != (Instruction *)0x0) {
          std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>::operator()
                    ((default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject> *)
                     &stack0xffffffffffffffc8,(MemoryObject *)local_38);
        }
      }
      ppIVar9 = (this->worklist_).c.
                super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
    } while ((this->worklist_).c.
             super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur != ppIVar9);
    SVar8 = SVar8 ^ SuccessWithoutChange;
  }
  return SVar8;
}

Assistant:

Pass::Status CopyPropagateArrays::Process() {
  bool modified = false;
  for (Function& function : *get_module()) {
    if (function.IsDeclaration()) {
      continue;
    }

    BasicBlock* entry_bb = &*function.begin();

    for (auto var_inst = entry_bb->begin();
         var_inst->opcode() == spv::Op::OpVariable; ++var_inst) {
      worklist_.push(&*var_inst);
    }
  }

  while (!worklist_.empty()) {
    Instruction* var_inst = worklist_.front();
    worklist_.pop();

    // Find the only store to the entire memory location, if it exists.
    Instruction* store_inst = FindStoreInstruction(&*var_inst);

    if (!store_inst) {
      continue;
    }

    std::unique_ptr<MemoryObject> source_object =
        FindSourceObjectIfPossible(&*var_inst, store_inst);

    if (source_object != nullptr) {
      if (!IsPointerToArrayType(var_inst->type_id()) &&
          source_object->GetStorageClass() != spv::StorageClass::Input) {
        continue;
      }

      if (CanUpdateUses(&*var_inst, source_object->GetPointerTypeId(this))) {
        modified = true;

        PropagateObject(&*var_inst, source_object.get(), store_inst);
      }
    }
  }

  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}